

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

double __thiscall doctest::detail::MessageBuilder::log(MessageBuilder *this,double __x)

{
  bool bVar1;
  reference ppIVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  bool isWarn;
  IReporter **curr_rep;
  iterator __end2;
  iterator __begin2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  String *other;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_40;
  long local_38;
  String local_20;
  MessageBuilder *local_8;
  
  local_8 = this;
  if ((this->logged & 1U) == 0) {
    other = &local_20;
    tlssPop();
    String::operator=((String *)this,other);
    String::~String((String *)this);
    this->logged = true;
  }
  local_38 = g_cs + 0x10d0;
  local_40._M_current =
       (IReporter **)
       std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                 (in_stack_ffffffffffffff88);
  std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
            (in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::
                 operator==<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                           ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90
                                                )),
                            (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                             *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
              ::operator*(&local_40);
    (*(*ppIVar2)->_vptr_IReporter[10])(*ppIVar2,this);
    __gnu_cxx::
    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
    ::operator++(&local_40);
  }
  if (((this->super_MessageData).m_severity & is_warn) == 0) {
    anon_unknown_14::addAssert(0);
    anon_unknown_14::addFailedAssert(0);
  }
  bVar1 = isDebuggerActive();
  dVar3 = extraout_XMM0_Qa;
  if (bVar1) {
    getContextOptions();
    dVar3 = extraout_XMM0_Qa_00;
  }
  return dVar3;
}

Assistant:

bool MessageBuilder::log() {
        if (!logged) {
            m_string = tlssPop();
            logged = true;
        }

        DOCTEST_ITERATE_THROUGH_REPORTERS(log_message, *this);

        const bool isWarn = m_severity & assertType::is_warn;

        // warn is just a message in this context so we don't treat it as an assert
        if(!isWarn) {
            addAssert(m_severity);
            addFailedAssert(m_severity);
        }

        return isDebuggerActive() && !getContextOptions()->no_breaks && !isWarn &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }